

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  char **end;
  int iVar7;
  FILE *in_stack_ffffffffffffffb8;
  OnigEncoding use_encs [1];
  size_t n;
  
  onig_initialize();
  srand(0x3039);
  XX_LEAD = 0;
  bVar1 = false;
  xx(0x19b,0,(char **)0x0," abab bccab ca",0,0,0,1,(int)in_stack_ffffffffffffffb8);
  end = p1;
  xx(0x19c,3,p1," abab bccab ca",8,0xb,0,0,(int)in_stack_ffffffffffffffb8);
  xx(0x19d,3,p1," abab bccab ca",8,0xb,1,0,(int)in_stack_ffffffffffffffb8);
  xx(0x19e,3,p2," XXXX AAA 1223 012345678bbb",0,0,0,1,(int)in_stack_ffffffffffffffb8);
  xx(0x19f,3,p2,"0123456789",9,10,0,0,(int)in_stack_ffffffffffffffb8);
  xx(0x1a0,10,p7,"abcde 555 qwert",6,9,0,0,(int)in_stack_ffffffffffffffb8);
  xx(0x1a1,2,p8,"",0,0,0,0,(int)in_stack_ffffffffffffffb8);
  XX_LEAD = 1;
  xx(0x1a5,0,(char **)0x0," abab bccab ca",0,0,0,1,(int)in_stack_ffffffffffffffb8);
  xx(0x1a6,3,p1," abab bccab ca",8,0xb,0,0,(int)in_stack_ffffffffffffffb8);
  xx(0x1a7,3,p1," abab bccab ca",8,0xb,1,0,(int)in_stack_ffffffffffffffb8);
  xx(0x1a8,3,p2," XXXX AAA 1223 012345678bbb",0,0,0,1,(int)in_stack_ffffffffffffffb8);
  xx(0x1a9,3,p2,"0123456789",9,10,0,0,(int)in_stack_ffffffffffffffb8);
  xx(0x1aa,10,p7,"abcde 555 qwert",6,9,0,0,(int)in_stack_ffffffffffffffb8);
  pFVar4 = fopen("kofu-utf8.txt","r");
  pFVar6 = (FILE *)" abab bccab ca";
  if (pFVar4 != (FILE *)0x0) {
    bVar1 = false;
    n = 0;
    in_stack_ffffffffffffffb8 = (FILE *)0x0;
    end = (char **)getdelim((char **)&stack0xffffffffffffffb8,&n,-1,pFVar4);
    fclose(pFVar4);
    pFVar6 = pFVar4;
    if (-1 < (long)end) {
      end = (char **)((long)end + (long)in_stack_ffffffffffffffb8);
      bVar1 = true;
      pFVar6 = in_stack_ffffffffffffffb8;
    }
  }
  iVar7 = (int)in_stack_ffffffffffffffb8;
  if (bVar1) {
    fprintf(_stdout,"FILE: %s, size: %d\n","kofu-utf8.txt",(ulong)(uint)((int)end - (int)pFVar6));
    xx(0x1b8,3,p2,(char *)pFVar6,10,0x16,0,0,iVar7);
    xx(0x1b9,4,p3,(char *)pFVar6,0x791cf,0x791d8,0,0,iVar7);
    xx(0x1ba,0x10,p4,(char *)pFVar6,0x50e,0x523,0,0,iVar7);
    pFVar4 = _stdout;
    iVar3 = nerror;
    iVar2 = nfail;
    iVar7 = nsucc;
    uVar5 = onig_version();
    fprintf(pFVar4,"\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
            (ulong)(uint)iVar7,(ulong)(uint)iVar2,(ulong)(uint)iVar3,uVar5);
    fputc(10,_stdout);
    time_compare(3,p2,(char *)pFVar6,(char *)end);
    time_compare(4,p3,(char *)pFVar6,(char *)end);
    time_compare(0x10,p4,(char *)pFVar6,(char *)end);
    time_compare(0xe,p5,(char *)pFVar6,(char *)end);
    time_compare(5,p6,(char *)pFVar6,(char *)end);
    fputc(10,_stdout);
    free(pFVar6);
  }
  else {
    fprintf(_stdout,"Ignore %s\n","kofu-utf8.txt");
    pFVar6 = _stdout;
    iVar3 = nerror;
    iVar2 = nfail;
    iVar7 = nsucc;
    uVar5 = onig_version();
    fprintf(pFVar6,"\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
            (ulong)(uint)iVar7,(ulong)(uint)iVar2,(ulong)(uint)iVar3,uVar5);
  }
  onig_end();
  return -(uint)(nerror != 0 || nfail != 0);
}

Assistant:

extern int
main(int argc, char* argv[])
{
#ifndef _WIN32
  int file_exist;
#endif
  int r;
  char *s, *end;
  OnigEncoding use_encs[1];

  use_encs[0] = ONIG_ENCODING_UTF8;
  onig_initialize(use_encs, sizeof(use_encs)/sizeof(use_encs[0]));

  srand(12345);

  XX_LEAD = ONIG_REGSET_POSITION_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);
  X2(p8, "", 0, 0);

  XX_LEAD = ONIG_REGSET_REGEX_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);

#ifndef _WIN32
  r = get_all_content_of_file(TEXT_PATH, &s, &end);
  if (r == 0) {
    fprintf(stdout, "FILE: %s, size: %d\n", TEXT_PATH, (int )(end - s));
    file_exist = 1;
  }
  else {
    fprintf(stdout, "Ignore %s\n", TEXT_PATH);
    file_exist = 0;
  }

  if (file_exist != 0) {
    X2(p2, s, 10, 22);
    X2(p3, s, 496079, 496088);
    X2(p4, s, 1294, 1315);
  }
#endif

  fprintf(stdout,
          "\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
          nsucc, nfail, nerror, onig_version());

#ifndef _WIN32
  if (file_exist != 0) {
    fprintf(stdout, "\n");
    time_compare(ASIZE(p2), p2, s, end);
    time_compare(ASIZE(p3), p3, s, end);
    time_compare(ASIZE(p4), p4, s, end);
    time_compare(ASIZE(p5), p5, s, end);
    time_compare(ASIZE(p6), p6, s, end);
    fprintf(stdout, "\n");
    free(s);
  }
#endif

  onig_end();

  return ((nfail == 0 && nerror == 0) ? 0 : -1);
}